

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NonAnsiPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NonAnsiPortListSyntax,slang::syntax::NonAnsiPortListSyntax_const&>
          (BumpAllocator *this,NonAnsiPortListSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  NonAnsiPortListSyntax *pNVar8;
  
  pNVar8 = (NonAnsiPortListSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NonAnsiPortListSyntax *)this->endPtr < pNVar8 + 1) {
    pNVar8 = (NonAnsiPortListSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pNVar8 + 1);
  }
  (pNVar8->super_PortListSyntax).super_SyntaxNode.previewNode =
       (args->super_PortListSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_PortListSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PortListSyntax).super_SyntaxNode.parent;
  (pNVar8->super_PortListSyntax).super_SyntaxNode.kind =
       (args->super_PortListSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar8->super_PortListSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pNVar8->super_PortListSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = (args->openParen).field_0x2;
  NVar6.raw = (args->openParen).numFlags.raw;
  uVar7 = (args->openParen).rawLen;
  pIVar2 = (args->openParen).info;
  (pNVar8->openParen).kind = (args->openParen).kind;
  (pNVar8->openParen).field_0x2 = uVar5;
  (pNVar8->openParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pNVar8->openParen).rawLen = uVar7;
  (pNVar8->openParen).info = pIVar2;
  uVar4 = *(undefined4 *)&(args->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->ports).super_SyntaxListBase.super_SyntaxNode.parent;
  (pNVar8->ports).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->ports).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar8->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pNVar8->ports).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pNVar8->ports).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->ports).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pNVar8->ports).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005b7e60;
  (pNVar8->ports).super_SyntaxListBase.childCount = (args->ports).super_SyntaxListBase.childCount;
  (pNVar8->ports).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005bbbe8;
  sVar3 = (args->ports).elements._M_extent._M_extent_value;
  (pNVar8->ports).elements._M_ptr = (args->ports).elements._M_ptr;
  (pNVar8->ports).elements._M_extent._M_extent_value = sVar3;
  uVar5 = (args->closeParen).field_0x2;
  NVar6.raw = (args->closeParen).numFlags.raw;
  uVar7 = (args->closeParen).rawLen;
  pIVar2 = (args->closeParen).info;
  (pNVar8->closeParen).kind = (args->closeParen).kind;
  (pNVar8->closeParen).field_0x2 = uVar5;
  (pNVar8->closeParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pNVar8->closeParen).rawLen = uVar7;
  (pNVar8->closeParen).info = pIVar2;
  return pNVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }